

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

Own<kj::_::AttachmentPromiseNode<kj::Array<const_kj::ArrayPtr<const_unsigned_char>_>_>_> __thiscall
kj::
heap<kj::_::AttachmentPromiseNode<kj::Array<kj::ArrayPtr<unsigned_char_const>const>>,kj::Own<kj::_::PromiseNode>,kj::Array<kj::ArrayPtr<unsigned_char_const>const>>
          (kj *this,Own<kj::_::PromiseNode> *params,
          Array<const_kj::ArrayPtr<const_unsigned_char>_> *params_1)

{
  AttachmentPromiseNodeBase *this_00;
  AttachmentPromiseNode<kj::Array<const_kj::ArrayPtr<const_unsigned_char>_>_> *extraout_RDX;
  Own<kj::_::AttachmentPromiseNode<kj::Array<const_kj::ArrayPtr<const_unsigned_char>_>_>_> OVar1;
  
  this_00 = (AttachmentPromiseNodeBase *)operator_new(0x30);
  _::AttachmentPromiseNodeBase::AttachmentPromiseNodeBase(this_00,params);
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0062c438;
  this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)params_1->ptr;
  this_00[1].dependency.disposer = (Disposer *)params_1->size_;
  this_00[1].dependency.ptr = (PromiseNode *)params_1->disposer;
  params_1->ptr = (ArrayPtr<const_unsigned_char> *)0x0;
  params_1->size_ = 0;
  *(undefined8 **)this =
       &_::
        HeapDisposer<kj::_::AttachmentPromiseNode<kj::Array<kj::ArrayPtr<unsigned_char_const>const>>>
        ::instance;
  *(AttachmentPromiseNodeBase **)(this + 8) = this_00;
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}